

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O3

bool __thiscall wasm::anon_unknown_0::PatternMatcher::match(PatternMatcher *this,Name funcName)

{
  char **value;
  bool bVar1;
  const_iterator cVar2;
  _Base_ptr p_Var3;
  undefined1 local_70 [8];
  Name funcName_local;
  long local_50 [2];
  _Rb_tree_node_base *local_40;
  PatternMatcher *local_38;
  
  funcName_local.super_IString.str._M_len = funcName.super_IString.str._M_str;
  local_70 = funcName.super_IString.str._M_len;
  cVar2 = std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::find(&(this->names)._M_t,(key_type *)local_70);
  bVar1 = true;
  if ((_Rb_tree_header *)cVar2._M_node == &(this->names)._M_t._M_impl.super__Rb_tree_header) {
    p_Var3 = (this->patterns)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_40 = &(this->patterns)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (p_Var3 != local_40) {
      local_38 = this;
      do {
        value = &funcName_local.super_IString.str._M_str;
        funcName_local.super_IString.str._M_str = (char *)local_50;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)value,funcName_local.super_IString.str._M_len,
                   (long)local_70 + funcName_local.super_IString.str._M_len);
        bVar1 = String::wildcardMatch((string *)(p_Var3 + 1),(string *)value);
        if ((long *)funcName_local.super_IString.str._M_str != local_50) {
          operator_delete(funcName_local.super_IString.str._M_str,local_50[0] + 1);
        }
        if (bVar1) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_38->patternsMatched,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var3 + 1));
          return true;
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while (p_Var3 != local_40);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool match(Name funcName) {
    if (names.count(funcName) > 0) {
      return true;
    } else {
      for (auto& pattern : patterns) {
        if (String::wildcardMatch(pattern, funcName.toString())) {
          patternsMatched.insert(pattern);
          return true;
        }
      }
    }
    return false;
  }